

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_eval.c
# Opt level: O3

l2_expr_info *
l2_eval_expr_lshift_rshift_rshift_unsigned1
          (l2_expr_info *__return_storage_ptr__,l2_scope *scope_p,l2_expr_info left_expr_info)

{
  long lVar1;
  l2_expr_info left_expr_info_00;
  boolean bVar2;
  l2_token *plVar3;
  char *pcVar4;
  int cols;
  int lines;
  char *pcVar5;
  char *pcVar6;
  l2_expr_info local_40;
  
  bVar2 = l2_parse_probe_next_token_by_type(L2_TOKEN_LSHIFT);
  lVar1 = left_expr_info.val._0_8_;
  if (bVar2 == '\0') {
    bVar2 = l2_parse_probe_next_token_by_type(L2_TOKEN_RSHIFT);
    if (bVar2 == '\0') {
      bVar2 = l2_parse_probe_next_token_by_type(L2_TOKEN_RSHIFT_UNSIGNED);
      if (bVar2 == '\0') {
        (__return_storage_ptr__->val).procedure.upper_scope_p =
             left_expr_info.val.procedure.upper_scope_p;
        *(long *)__return_storage_ptr__ = left_expr_info._0_8_;
        (__return_storage_ptr__->val).integer = lVar1;
        return __return_storage_ptr__;
      }
      l2_parse_token_forward();
      plVar3 = l2_parse_token_current();
      l2_eval_expr_plus_sub(&local_40,scope_p);
      if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_INTEGER) {
        if (local_40.val_type == L2_EXPR_VAL_TYPE_INTEGER) {
          local_40.val.real =
               (double)(ulong)((uint)left_expr_info.val.procedure.entry_pos >>
                              (local_40.val.bool & 0x1fU));
          goto LAB_0010a159;
        }
        if (local_40.val_type == L2_EXPR_VAL_TYPE_REAL) {
          lines = plVar3->current_line;
          cols = plVar3->current_col;
          pcVar4 = ">>>";
          goto LAB_0010a3df;
        }
        if (local_40.val_type == L2_EXPR_VAL_TYPE_BOOL) {
          lines = plVar3->current_line;
          cols = plVar3->current_col;
          pcVar4 = ">>>";
          goto LAB_0010a30d;
        }
      }
      else {
        if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_REAL) {
          lines = plVar3->current_line;
          cols = plVar3->current_col;
          if (local_40.val_type == L2_EXPR_VAL_TYPE_BOOL) {
            pcVar4 = ">>>";
            goto LAB_0010a43a;
          }
          if (local_40.val_type == L2_EXPR_VAL_TYPE_REAL) {
            pcVar4 = ">>>";
            goto LAB_0010a45b;
          }
          if (local_40.val_type != L2_EXPR_VAL_TYPE_INTEGER) goto LAB_0010a321;
          pcVar4 = ">>>";
          goto LAB_0010a3c0;
        }
        if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_BOOL) {
          lines = plVar3->current_line;
          cols = plVar3->current_col;
          if (local_40.val_type != L2_EXPR_VAL_TYPE_BOOL) {
            if (local_40.val_type == L2_EXPR_VAL_TYPE_REAL) {
              pcVar4 = ">>>";
              goto LAB_0010a423;
            }
            if (local_40.val_type != L2_EXPR_VAL_TYPE_INTEGER) goto LAB_0010a321;
            pcVar4 = ">>>";
            goto LAB_0010a2e4;
          }
          pcVar4 = ">>>";
LAB_0010a413:
          pcVar5 = "bool";
          pcVar6 = pcVar5;
          goto LAB_0010a44d;
        }
      }
    }
    else {
      l2_parse_token_forward();
      plVar3 = l2_parse_token_current();
      l2_eval_expr_plus_sub(&local_40,scope_p);
      if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_INTEGER) {
        if (local_40.val_type == L2_EXPR_VAL_TYPE_INTEGER) {
          local_40.val.integer = lVar1 >> (local_40.val.bool & 0x3fU);
LAB_0010a159:
          local_40.val_type = L2_EXPR_VAL_TYPE_INTEGER;
          left_expr_info_00._4_4_ = local_40._4_4_;
          left_expr_info_00.val_type = 2;
          left_expr_info_00.val.integer = local_40.val.integer;
          left_expr_info_00.val.procedure.upper_scope_p = local_40.val.procedure.upper_scope_p;
          l2_eval_expr_lshift_rshift_rshift_unsigned1
                    (__return_storage_ptr__,scope_p,left_expr_info_00);
          return __return_storage_ptr__;
        }
        if (local_40.val_type == L2_EXPR_VAL_TYPE_REAL) {
          lines = plVar3->current_line;
          cols = plVar3->current_col;
          pcVar4 = ">>";
LAB_0010a3df:
          pcVar5 = "integer";
LAB_0010a42a:
          pcVar6 = "real";
          goto LAB_0010a44d;
        }
        if (local_40.val_type == L2_EXPR_VAL_TYPE_BOOL) {
          lines = plVar3->current_line;
          cols = plVar3->current_col;
          pcVar4 = ">>";
LAB_0010a30d:
          pcVar5 = "integer";
          goto LAB_0010a441;
        }
      }
      else {
        if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_REAL) {
          lines = plVar3->current_line;
          cols = plVar3->current_col;
          if (local_40.val_type == L2_EXPR_VAL_TYPE_BOOL) {
            pcVar4 = ">>";
LAB_0010a43a:
            pcVar5 = "real";
LAB_0010a441:
            pcVar6 = "bool";
            goto LAB_0010a44d;
          }
          if (local_40.val_type == L2_EXPR_VAL_TYPE_REAL) {
            pcVar4 = ">>";
LAB_0010a45b:
            pcVar5 = "real";
            pcVar6 = pcVar5;
            goto LAB_0010a44d;
          }
          if (local_40.val_type != L2_EXPR_VAL_TYPE_INTEGER) goto LAB_0010a321;
          pcVar4 = ">>";
LAB_0010a3c0:
          pcVar5 = "real";
LAB_0010a3c7:
          pcVar6 = "integer";
LAB_0010a44d:
          local_40.val_type = L2_EXPR_VAL_TYPE_INTEGER;
          l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE,lines,cols
                           ,pcVar4,pcVar5,pcVar6);
        }
        if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_BOOL) {
          lines = plVar3->current_line;
          cols = plVar3->current_col;
          if (local_40.val_type == L2_EXPR_VAL_TYPE_BOOL) {
            pcVar4 = ">>";
            goto LAB_0010a413;
          }
          if (local_40.val_type != L2_EXPR_VAL_TYPE_REAL) {
            if (local_40.val_type != L2_EXPR_VAL_TYPE_INTEGER) goto LAB_0010a321;
            pcVar4 = ">>";
            goto LAB_0010a2e4;
          }
          pcVar4 = ">>";
LAB_0010a423:
          pcVar5 = "bool";
          goto LAB_0010a42a;
        }
      }
    }
  }
  else {
    l2_parse_token_forward();
    plVar3 = l2_parse_token_current();
    l2_eval_expr_plus_sub(&local_40,scope_p);
    if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_INTEGER) {
      if (local_40.val_type == L2_EXPR_VAL_TYPE_INTEGER) {
        local_40.val.integer = lVar1 << (local_40.val.bool & 0x3fU);
        goto LAB_0010a159;
      }
      if (local_40.val_type == L2_EXPR_VAL_TYPE_REAL) {
        lines = plVar3->current_line;
        cols = plVar3->current_col;
        pcVar4 = "<<";
        goto LAB_0010a3df;
      }
      if (local_40.val_type == L2_EXPR_VAL_TYPE_BOOL) {
        lines = plVar3->current_line;
        cols = plVar3->current_col;
        pcVar4 = "<<";
        goto LAB_0010a30d;
      }
    }
    else {
      if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_REAL) {
        lines = plVar3->current_line;
        cols = plVar3->current_col;
        if (local_40.val_type == L2_EXPR_VAL_TYPE_BOOL) {
          pcVar4 = "<<";
          goto LAB_0010a43a;
        }
        if (local_40.val_type == L2_EXPR_VAL_TYPE_REAL) {
          pcVar4 = "<<";
          goto LAB_0010a45b;
        }
        if (local_40.val_type != L2_EXPR_VAL_TYPE_INTEGER) goto LAB_0010a321;
        pcVar4 = "<<";
        goto LAB_0010a3c0;
      }
      if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_BOOL) {
        lines = plVar3->current_line;
        cols = plVar3->current_col;
        if (local_40.val_type == L2_EXPR_VAL_TYPE_BOOL) {
          pcVar4 = "<<";
          goto LAB_0010a413;
        }
        if (local_40.val_type == L2_EXPR_VAL_TYPE_REAL) {
          pcVar4 = "<<";
          goto LAB_0010a423;
        }
        if (local_40.val_type != L2_EXPR_VAL_TYPE_INTEGER) goto LAB_0010a321;
        pcVar4 = "<<";
LAB_0010a2e4:
        pcVar5 = "bool";
        goto LAB_0010a3c7;
      }
    }
  }
  lines = plVar3->current_line;
  cols = plVar3->current_col;
LAB_0010a321:
  local_40.val_type = L2_EXPR_VAL_TYPE_INTEGER;
  l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE,lines,cols);
}

Assistant:

l2_expr_info l2_eval_expr_lshift_rshift_rshift_unsigned1(l2_scope *scope_p, l2_expr_info left_expr_info) {
    l2_expr_info right_expr_info, new_left_expr_info;
    _declr_current_token_p

    _if_type (L2_TOKEN_LSHIFT) /* << */
    {
        _get_current_token_p
        right_expr_info = l2_eval_expr_plus_sub(scope_p);
        new_left_expr_info.val_type = L2_EXPR_VAL_TYPE_INTEGER;
        switch (left_expr_info.val_type) {
            case L2_EXPR_VAL_TYPE_INTEGER:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        new_left_expr_info.val.integer = (left_expr_info.val.integer << right_expr_info.val.integer);
                        break;

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "<<", "integer", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "<<", "integer", "real");

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            case L2_EXPR_VAL_TYPE_BOOL:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "<<", "bool", "integer");

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "<<", "bool", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "<<", "bool", "real");

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            case L2_EXPR_VAL_TYPE_REAL:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "<<", "real", "integer");

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "<<", "real", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "<<", "real", "real");

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            default:
                l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
        }
        return l2_eval_expr_lshift_rshift_rshift_unsigned1(scope_p, new_left_expr_info);

    }
    _elif_type (L2_TOKEN_RSHIFT) /* >> */
    {
        _get_current_token_p
        right_expr_info = l2_eval_expr_plus_sub(scope_p);
        new_left_expr_info.val_type = L2_EXPR_VAL_TYPE_INTEGER;
        switch (left_expr_info.val_type) {
            case L2_EXPR_VAL_TYPE_INTEGER:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        new_left_expr_info.val.integer = (left_expr_info.val.integer >> right_expr_info.val.integer);
                        break;

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>", "integer", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>", "integer", "real");

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            case L2_EXPR_VAL_TYPE_BOOL:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>", "bool", "integer");

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>", "bool", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>", "bool", "real");

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            case L2_EXPR_VAL_TYPE_REAL:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>", "real", "integer");

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>", "real", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>", "real", "real");

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            default:
                l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
        }
        return l2_eval_expr_lshift_rshift_rshift_unsigned1(scope_p, new_left_expr_info);

    }
    _elif_type (L2_TOKEN_RSHIFT_UNSIGNED) /* >>> */
    {
        _get_current_token_p
        right_expr_info = l2_eval_expr_plus_sub(scope_p);
        new_left_expr_info.val_type = L2_EXPR_VAL_TYPE_INTEGER;
        switch (left_expr_info.val_type) {
            case L2_EXPR_VAL_TYPE_INTEGER:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        new_left_expr_info.val.integer = (((unsigned int)left_expr_info.val.integer) >> right_expr_info.val.integer);
                        break;

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>>", "integer", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>>", "integer", "real");

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            case L2_EXPR_VAL_TYPE_BOOL:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>>", "bool", "integer");

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>>", "bool", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>>", "bool", "real");

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            case L2_EXPR_VAL_TYPE_REAL:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>>", "real", "integer");

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>>", "real", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>>", "real", "real");

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            default:
                l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
        }
        return l2_eval_expr_lshift_rshift_rshift_unsigned1(scope_p, new_left_expr_info);

    }
    _else
    {
        return left_expr_info;
    }
}